

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP5Deserializer::ReverseDimensions
          (BP5Deserializer *this,size_t *Dimensions,size_t count,size_t times)

{
  size_t sVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t *psVar4;
  long lVar5;
  
  psVar2 = Dimensions + (count - 1);
  for (sVar3 = 0; sVar3 != times; sVar3 = sVar3 + 1) {
    psVar4 = Dimensions;
    for (lVar5 = 0; -lVar5 != count >> 1; lVar5 = lVar5 + -1) {
      sVar1 = *psVar4;
      *psVar4 = psVar2[lVar5];
      psVar2[lVar5] = sVar1;
      psVar4 = psVar4 + 1;
    }
    psVar2 = psVar2 + count;
    Dimensions = Dimensions + count;
  }
  return;
}

Assistant:

void BP5Deserializer::ReverseDimensions(size_t *Dimensions, size_t count, size_t times)
{
    size_t Offset = 0;
    for (size_t j = 0; j < times; j++)
    {
        for (size_t i = 0; i < count / 2; i++)
        {
            size_t tmp = Dimensions[Offset + i];
            Dimensions[Offset + i] = Dimensions[Offset + count - i - 1];
            Dimensions[Offset + count - i - 1] = tmp;
        }
        Offset += count;
    }
}